

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BoyerMooreState.h
# Opt level: O2

void __thiscall
axl::sl::BoyerMooreStateBase<char>::advance<false>
          (BoyerMooreStateBase<char> *this,size_t i,char *p,size_t length)

{
  size_t *psVar1;
  long lVar2;
  
  this->m_offset = this->m_offset + i;
  psVar1 = &(this->m_tail).m_length;
  lVar2 = i - *psVar1;
  if (i < *psVar1) {
    CircularBufferBase<char>::dropFront(&this->m_tail,i);
  }
  else {
    length = length - lVar2;
    (this->m_tail).m_front = 0;
    (this->m_tail).m_back = 0;
    (this->m_tail).m_length = 0;
    p = p + lVar2;
  }
  CircularBufferBase<char>::writeBack(&this->m_tail,p,length);
  return;
}

Assistant:

void
	advance(
		size_t i,
		const C* p,
		size_t length
	) {
		m_offset += i;

		size_t tailLength = m_tail.getDataLength();
		if (i >= tailLength) {
			i -= tailLength;
			size_t copyLength = length - i;
			m_tail.clear();
			size_t result = m_tail.write(
				IsReverse ?
					p + length - copyLength - i :
					p + i,
				copyLength
			);
			ASSERT(result == copyLength);
		} else if (IsReverse) {
			m_tail.dropBack(i);
			size_t result = m_tail.writeFront(p, length);
			ASSERT(result == length);
		} else {
			m_tail.dropFront(i);
			size_t result = m_tail.writeBack(p, length);
			ASSERT(result == length);
		}
	}